

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O3

void printTreeView(int id,int tabs)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  char *__s;
  long lVar4;
  
  iVar1 = inodes[id].i_blocks[0];
  lVar4 = 0;
  do {
    if (emptyspaces[lVar4 * 0x100 + (long)iVar1 * 0x1000] != '\0') {
      iVar3 = tabs;
      if (0 < tabs) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      __s = emptyspaces + lVar4 * 0x100 + (long)iVar1 * 0x1000;
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      if ((inodes[*(int *)(__s + 0xfc)].i_mode == 1) &&
         ((*__s != '.' || ((__s[1] != '\0' && ((__s[1] != '.' || (__s[2] != '\0')))))))) {
        printTreeView(*(int *)(__s + 0xfc),tabs + 1);
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

void printTreeView(int id, int tabs) {
    dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
    int i;
    for (i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "")) {
            printLines(tabs);
            cout << p->dirs[i].name << endl;
            int nextid = p->dirs[i].inode_id;
            if (inodes[nextid].i_mode == A_FOLDER && strcmp(p->dirs[i].name, ".") && strcmp(p->dirs[i].name, "..")) {
                printTreeView(nextid, tabs + 1);
            }
        }
    }
}